

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ringbuffer.cpp
# Opt level: O0

RingBufferPtr RingBuffer::Create(size_t sz,size_t elem_sz,int limit_writes)

{
  unsigned_long uVar1;
  overflow_error *this;
  pointer pRVar2;
  int in_ECX;
  ulong in_RDX;
  ulong in_RSI;
  __uniq_ptr_data<RingBuffer,_std::default_delete<RingBuffer>,_true,_true> in_RDI;
  size_t bufbytes;
  size_t power_of_two;
  RingBufferPtr *rb;
  pointer in_stack_ffffffffffffff68;
  ulong uVar3;
  RingBuffer *in_stack_ffffffffffffff70;
  FamCount in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffff80;
  ulong local_28;
  
  local_28 = 0;
  if (in_RSI != 0) {
    local_28 = in_RSI >> 1 | in_RSI;
    local_28 = local_28 >> 2 | local_28;
    local_28 = local_28 >> 4 | local_28;
    local_28 = local_28 >> 8 | local_28;
    local_28 = local_28 >> 0x10 | local_28;
    local_28 = local_28 >> 0x20 | local_28;
  }
  if ((in_RSI < local_28 + 1) &&
     (uVar1 = std::numeric_limits<unsigned_long>::max(), local_28 + 1 <= uVar1 / in_RDX)) {
    operator_new(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    RingBuffer(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
    std::unique_ptr<RingBuffer,std::default_delete<RingBuffer>>::
    unique_ptr<std::default_delete<RingBuffer>,void>
              ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)in_stack_ffffffffffffff70
               ,in_stack_ffffffffffffff68);
    uVar3 = local_28;
    if (in_ECX != 0) {
      uVar3 = in_RSI;
    }
    pRVar2 = std::unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_>::operator->
                       ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)0x21c6cb);
    pRVar2->mWriteSize = uVar3;
    pRVar2 = std::unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_>::operator->
                       ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)0x21c6eb);
    pRVar2->mSizeMask = local_28;
    pRVar2 = std::unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_>::operator->
                       ((unique_ptr<RingBuffer,_std::default_delete<RingBuffer>_> *)0x21c70b);
    pRVar2->mElemSize = in_RDX;
    return (__uniq_ptr_data<RingBuffer,_std::default_delete<RingBuffer>,_true,_true>)
           (tuple<RingBuffer_*,_std::default_delete<RingBuffer>_>)
           in_RDI.super___uniq_ptr_impl<RingBuffer,_std::default_delete<RingBuffer>_>._M_t.
           super__Tuple_impl<0UL,_RingBuffer_*,_std::default_delete<RingBuffer>_>.
           super__Head_base<0UL,_RingBuffer_*,_false>._M_head_impl;
  }
  this = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this,"Ring buffer size overflow");
  __cxa_throw(this,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

RingBufferPtr RingBuffer::Create(size_t sz, size_t elem_sz, int limit_writes)
{
    size_t power_of_two{0u};
    if(sz > 0)
    {
        power_of_two = sz;
        power_of_two |= power_of_two>>1;
        power_of_two |= power_of_two>>2;
        power_of_two |= power_of_two>>4;
        power_of_two |= power_of_two>>8;
        power_of_two |= power_of_two>>16;
#if SIZE_MAX > UINT_MAX
        power_of_two |= power_of_two>>32;
#endif
    }
    ++power_of_two;
    if(power_of_two <= sz || power_of_two > std::numeric_limits<size_t>::max()/elem_sz)
        throw std::overflow_error{"Ring buffer size overflow"};

    const size_t bufbytes{power_of_two * elem_sz};
    RingBufferPtr rb{new(FamCount(bufbytes)) RingBuffer{bufbytes}};
    rb->mWriteSize = limit_writes ? sz : (power_of_two-1);
    rb->mSizeMask = power_of_two - 1;
    rb->mElemSize = elem_sz;

    return rb;
}